

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrSpatialGraphNodeBindingPropertiesMSFT *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  long lVar6;
  XrSpatialGraphNodeBindingPropertiesMSFT *in_stack_fffffffffffffbb8;
  string nodeid_prefix;
  string type_prefix;
  string next_prefix;
  undefined1 local_3c8 [32];
  string local_3a8;
  string local_388;
  string nodeid_array_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  ostringstream oss_nodeId_array;
  string poseinnodespace_prefix;
  
  PointerToHexString<XrSpatialGraphNodeBindingPropertiesMSFT>(in_stack_fffffffffffffbb8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_nodeId_array)
  ;
  std::__cxx11::string::~string((string *)&oss_nodeId_array);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_nodeId_array,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_nodeId_array);
    std::__cxx11::string::~string((string *)&oss_nodeId_array);
  }
  else {
    _oss_nodeId_array = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_nodeId_array);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_nodeId_array);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_388,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_388,contents);
  std::__cxx11::string::~string((string *)&local_388);
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&nodeid_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&nodeid_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_nodeId_array);
  poVar4 = std::operator<<((ostream *)&oss_nodeId_array,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::operator<<(poVar4,(char *)value->nodeId);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])0x211dfa,&nodeid_prefix,&poseinnodespace_prefix);
  std::__cxx11::string::~string((string *)&poseinnodespace_prefix);
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    std::__cxx11::string::string((string *)&nodeid_array_prefix,(string *)&nodeid_prefix);
    std::__cxx11::string::append((char *)&nodeid_array_prefix);
    std::__cxx11::to_string(&poseinnodespace_prefix,(uint)lVar6);
    std::__cxx11::string::append((string *)&nodeid_array_prefix);
    std::__cxx11::string::~string((string *)&poseinnodespace_prefix);
    std::__cxx11::string::append((char *)&nodeid_array_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&poseinnodespace_prefix);
    poVar4 = std::operator<<((ostream *)&poseinnodespace_prefix,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::operator<<(poVar4,value->nodeId[lVar6]);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [8])"uint8_t",&nodeid_array_prefix,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&poseinnodespace_prefix);
    std::__cxx11::string::~string((string *)&nodeid_array_prefix);
  }
  std::__cxx11::string::string((string *)&poseinnodespace_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&poseinnodespace_prefix);
  std::__cxx11::string::string((string *)(local_3c8 + 0x20),(string *)&poseinnodespace_prefix);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_3c8;
  std::__cxx11::string::string
            ((string *)gen_dispatch_table_00,"XrPosef",(allocator *)&nodeid_array_prefix);
  bVar2 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->poseInNodeSpace,(string *)(local_3c8 + 0x20),
                     (string *)local_3c8,false,contents);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)(local_3c8 + 0x20));
  if (bVar2) {
    std::__cxx11::string::~string((string *)&poseinnodespace_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_nodeId_array);
    std::__cxx11::string::~string((string *)&nodeid_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpatialGraphNodeBindingPropertiesMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string nodeid_prefix = prefix;
        nodeid_prefix += "nodeId";
        std::ostringstream oss_nodeId_array;
        oss_nodeId_array << "0x" << std::hex << (value->nodeId);
        contents.emplace_back("uint8_t*", nodeid_prefix, oss_nodeId_array.str());
        for (uint32_t value_nodeid_inc = 0; value_nodeid_inc < XR_GUID_SIZE_MSFT; ++value_nodeid_inc) {
            std::string nodeid_array_prefix = nodeid_prefix;
            nodeid_array_prefix += "[";
            nodeid_array_prefix += std::to_string(value_nodeid_inc);
            nodeid_array_prefix += "]";
            std::ostringstream oss_nodeId;
            oss_nodeId << "0x" << std::hex << (value->nodeId[value_nodeid_inc]);
            contents.emplace_back("uint8_t", nodeid_array_prefix, oss_nodeId.str());
        }
        std::string poseinnodespace_prefix = prefix;
        poseinnodespace_prefix += "poseInNodeSpace";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->poseInNodeSpace, poseinnodespace_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}